

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddCustomCommand(void *arg,char *source,char *command,int numArgs,char **args,int numDepends,
                       char **depends,int numOutputs,char **outputs,char *target)

{
  pointer *this;
  char *pcVar1;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  char *local_190;
  char *no_comment;
  value_type local_180;
  int local_15c;
  undefined1 local_158 [4];
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs2;
  value_type local_138;
  int local_114;
  undefined1 local_110 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  cmCustomCommandLines commandLines;
  value_type local_d8;
  int local_b8;
  allocator local_b1;
  int i;
  allocator local_79;
  undefined1 local_78 [8];
  string expand;
  cmCustomCommandLine commandLine;
  cmMakefile *mf;
  int numDepends_local;
  char **args_local;
  int numArgs_local;
  char *command_local;
  char *source_local;
  void *arg_local;
  
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,command,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,pcVar1,&local_b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&expand.field_2 + 8),(value_type *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  for (local_b8 = 0; local_b8 < numArgs; local_b8 = local_b8 + 1) {
    std::__cxx11::string::operator=((string *)local_78,args[local_b8]);
    pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,pcVar1,
               (allocator *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&expand.field_2 + 8),&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  this = &depends2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)this);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)this,
             (value_type *)((long)&expand.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110);
  for (local_114 = 0; local_114 < numDepends; local_114 = local_114 + 1) {
    std::__cxx11::string::operator=((string *)local_78,depends[local_114]);
    pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_138,pcVar1,
               (allocator *)
               ((long)&outputs2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_110,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&outputs2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_158);
  for (local_15c = 0; local_15c < numOutputs; local_15c = local_15c + 1) {
    std::__cxx11::string::operator=((string *)local_78,outputs[local_15c]);
    pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,pcVar1,(allocator *)((long)&no_comment + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_158,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)((long)&no_comment + 7));
  }
  local_190 = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,target,&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,source,&local_1d9);
  cmMakefile::AddCustomCommandOldStyle
            ((cmMakefile *)arg,&local_1b0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_110,&local_1d8,
             (cmCustomCommandLines *)
             &depends2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_190);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &depends2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_78);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  return;
}

Assistant:

void CCONV cmAddCustomCommand(void* arg, const char* source,
                              const char* command, int numArgs,
                              const char** args, int numDepends,
                              const char** depends, int numOutputs,
                              const char** outputs, const char* target)
{
  // Get the makefile instance.  Perform an extra variable expansion
  // now because the API caller expects it.
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  // Construct the command line for the command.
  cmCustomCommandLine commandLine;
  std::string expand = command;
  commandLine.push_back(mf->ExpandVariablesInString(expand));
  for (int i = 0; i < numArgs; ++i) {
    expand = args[i];
    commandLine.push_back(mf->ExpandVariablesInString(expand));
  }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Accumulate the list of dependencies.
  std::vector<std::string> depends2;
  for (int i = 0; i < numDepends; ++i) {
    expand = depends[i];
    depends2.push_back(mf->ExpandVariablesInString(expand));
  }

  // Accumulate the list of outputs.
  std::vector<std::string> outputs2;
  for (int i = 0; i < numOutputs; ++i) {
    expand = outputs[i];
    outputs2.push_back(mf->ExpandVariablesInString(expand));
  }

  // Pass the call to the makefile instance.
  const char* no_comment = CM_NULLPTR;
  mf->AddCustomCommandOldStyle(target, outputs2, depends2, source,
                               commandLines, no_comment);
}